

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Gia_Man_t * Lf_ManPerformMapping(Gia_Man_t *p,Jf_Par_t *pPars)

{
  Tim_Man_t *p_00;
  int iVar1;
  Tim_Man_t *pTVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *p_01;
  
  if ((((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
      (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 == 0)) ||
     (iVar1 = Gia_ManIsNormalized(p), iVar1 == 0)) {
    pGVar3 = Lf_ManPerformMappingInt(p,pPars);
    Gia_ManTransferTiming(pGVar3,p);
    return pGVar3;
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  pTVar2 = Tim_ManDup(p_00,1);
  p->pManTime = pTVar2;
  pGVar3 = Gia_ManDupUnnormalize(p);
  if (pGVar3 == (Gia_Man_t *)0x0) {
    return (Gia_Man_t *)0x0;
  }
  Gia_ManTransferTiming(pGVar3,p);
  p_01 = Lf_ManPerformMappingInt(pGVar3,pPars);
  if (p_01 != pGVar3) {
    Gia_ManTransferTiming(p_01,pGVar3);
    Gia_ManStop(pGVar3);
  }
  pGVar3 = Gia_ManDupNormalize(p_01,0);
  Gia_ManTransferMapping(pGVar3,p_01);
  Gia_ManTransferTiming(pGVar3,p_01);
  Gia_ManStop(p_01);
  Tim_ManStop((Tim_Man_t *)pGVar3->pManTime);
  pGVar3->pManTime = p_00;
  iVar1 = Gia_ManIsNormalized(pGVar3);
  if (iVar1 != 0) {
    return pGVar3;
  }
  __assert_fail("Gia_ManIsNormalized(pNew)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                ,0x8ad,"Gia_Man_t *Lf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Gia_Man_t * Lf_ManPerformMapping( Gia_Man_t * p, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew;
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) && Gia_ManIsNormalized(p) )
    {
        Tim_Man_t * pTimOld = (Tim_Man_t *)p->pManTime;
        p->pManTime = Tim_ManDup( pTimOld, 1 );
        pNew = Gia_ManDupUnnormalize( p );
        if ( pNew == NULL )
            return NULL;
        Gia_ManTransferTiming( pNew, p );
        p = pNew;
        // mapping
        pNew = Lf_ManPerformMappingInt( p, pPars );
        if ( pNew != p )
        {
            Gia_ManTransferTiming( pNew, p );
            Gia_ManStop( p );
        }
        // normalize
        pNew = Gia_ManDupNormalize( p = pNew, 0 );
        Gia_ManTransferMapping( pNew, p );
//        Gia_ManTransferPacking( pNew, p );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p ); // do not delete if the original one!
        // cleanup
        Tim_ManStop( (Tim_Man_t *)pNew->pManTime );
        pNew->pManTime = pTimOld;
        assert( Gia_ManIsNormalized(pNew) );
    }
    else 
    {
        // mapping
        pNew = Lf_ManPerformMappingInt( p, pPars );
        Gia_ManTransferTiming( pNew, p );
    }
    return pNew;
}